

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O3

NgramBuilder NgramBuilder_init(size_t *gram_nums,uint32_t order)

{
  size_t sVar1;
  NgramBuilder pNVar2;
  HashVocab pHVar3;
  size_t *__dest;
  size_t *psVar4;
  ulong uVar5;
  char *pcVar6;
  char **ppcVar7;
  uint uVar8;
  
  if (order != 0) {
    pNVar2 = (NgramBuilder)malloc(0x48);
    pHVar3 = HashVocab_init(*gram_nums);
    pNVar2->vocab = pHVar3;
    sVar1 = (ulong)order * 8;
    __dest = (size_t *)malloc(sVar1);
    pNVar2->gram_nums = __dest;
    psVar4 = (size_t *)calloc(1,sVar1);
    pNVar2->added_gram_nums = psVar4;
    memcpy(__dest,gram_nums,sVar1);
    uVar5 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 + (int)gram_nums[uVar5];
      uVar5 = uVar5 + 1;
    } while (order != uVar5);
    sVar1 = (ulong)uVar8 * 0x18;
    pNVar2->cache_size = sVar1;
    pNVar2->used_cache_size = 0;
    pcVar6 = (char *)malloc(sVar1);
    pNVar2->ngram_cache = pcVar6;
    ppcVar7 = (char **)malloc((ulong)uVar8 * 8);
    pNVar2->ngram_offsets = ppcVar7;
    pNVar2->added_total_gram_num = 0;
    pNVar2->order = order;
    return pNVar2;
  }
  __assert_fail("order > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c",
                0x135,"NgramBuilder NgramBuilder_init(const size_t *, uint32_t)");
}

Assistant:

NgramBuilder NgramBuilder_init(const size_t* gram_nums, uint32_t order){
    assert(order > 0);
    NgramBuilder builder = malloc(sizeof(struct NgramBuilder_T));
    builder->vocab = HashVocab_init(gram_nums[0]);
    builder->gram_nums = malloc(order*sizeof(size_t));
    builder->added_gram_nums = malloc(order*sizeof(size_t));
    uint32_t total_num = 0;
    for (uint32_t i = 0;i< order;i++) {
        builder->gram_nums[i] = gram_nums[i];
        builder->added_gram_nums[i] = 0;
        total_num += gram_nums[i];
    }

    builder->cache_size = avg_ngram_len*total_num;
    builder->used_cache_size = 0;
    builder->ngram_cache = malloc(builder->cache_size);

    builder->ngram_offsets = malloc(total_num * sizeof(char*));
    builder->added_total_gram_num = 0;
    builder->order = order;
    return builder;
}